

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

char * url_encode(char *s,size_t n)

{
  char cVar1;
  char local_36 [2];
  uint local_34;
  char ch [2];
  size_t sStack_30;
  uint i;
  size_t len;
  char *r;
  size_t n_local;
  char *s_local;
  
  sStack_30 = n << 1;
  s_local = (char *)malloc(sStack_30);
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    strcpy(s_local,"");
    for (local_34 = 0; local_34 < n; local_34 = local_34 + 1) {
      cVar1 = s[local_34];
      if (cVar1 == '\n') {
        strncat(s_local,"%0A",sStack_30);
      }
      else if (cVar1 == '+') {
        strncat(s_local,"%2B",sStack_30);
      }
      else if (cVar1 == '-') {
        strncat(s_local,"%2D",sStack_30);
      }
      else if (cVar1 == '=') {
        strncat(s_local,"%3D",sStack_30);
      }
      else {
        local_36[0] = s[local_34];
        local_36[1] = 0;
        strncat(s_local,local_36,sStack_30);
      }
    }
    s_local[sStack_30 - 1] = '\0';
  }
  return s_local;
}

Assistant:

char * url_encode(char *s, size_t n) {
	char	*r;
	size_t	len;
	unsigned int     i;
	char    ch[2];

	/* Allocate 2 times bigger space than the original string */
	len = 2 * n;
	r = (char *)malloc(len);
	if (r == NULL) {
		return NULL;
	}
#ifdef WIN32
	strcpy_s(r, sizeof(r), "");
#else
	strcpy(r, "");
#endif

	/* Copy data */
	for (i = 0; i < n; i++) {
		switch (*(s+i)) {
			case '+':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2B", len);
				strncat(r, "%2B", len);
#else
				strncat(r, "%2B", len);
#endif
				break;
			case '-':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2D", len);
				strncat(r, "%2D", len);
#else
				strncat(r, "%2D", len);
#endif
				break;
			case '=':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%3D", len);
				strncat(r, "%3D", len);
#else
				strncat(r, "%3D", len);
#endif
				break;
			case '\n':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%0A", len);
				strncat(r, "%0A", len);
#else
				strncat(r, "%0A", len);
#endif
				break;
			default:
				ch[0] = *(s+i);
				ch[1] = '\0';
#ifdef WIN32
				//strncat_s(r, sizeof(r), ch, len);
				strncat(r, ch, len);
#else
				strncat(r, ch, len);
#endif
				break;
		}
	}
	r[len-1] = '\0';
	return r;
}